

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

ssize_t __thiscall DataStream::read(DataStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  pointer pbVar4;
  pointer pbVar5;
  char *pcVar6;
  undefined4 in_register_00000034;
  void *pvVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (__buf == (void *)0x0) goto LAB_00144679;
  uVar3 = this->m_read_pos;
  pvVar7 = (void *)~uVar3;
  if (__buf <= pvVar7) {
    uVar1 = uVar3 + (long)__buf;
    pbVar4 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 <= (ulong)((long)(this->vch).
                               super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pbVar4)) {
      memcpy((void *)CONCAT44(in_register_00000034,__fd),pbVar4 + uVar3,(size_t)__buf);
      if (pvVar7 < __buf) {
LAB_001446f5:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        pbVar4 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (uVar1 == (long)pbVar5 - (long)pbVar4) {
          this->m_read_pos = 0;
          if (pbVar5 != pbVar4) {
            (this->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
            .super__Vector_impl_data._M_finish = pbVar4;
          }
        }
        else {
          if (pvVar7 < __buf) goto LAB_001446f5;
          this->m_read_pos = uVar1;
        }
LAB_00144679:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return *(long *)(in_FS_OFFSET + 0x28);
        }
      }
      goto LAB_00144736;
    }
  }
  pcVar6 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure(pcVar6,(error_code *)"DataStream::read(): end of data")
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    __cxa_throw(pcVar6,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_00144736:
  __stack_chk_fail();
}

Assistant:

void read(Span<value_type> dst)
    {
        if (dst.size() == 0) return;

        // Read from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, dst.size())};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::read(): end of data");
        }
        memcpy(dst.data(), &vch[m_read_pos], dst.size());
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }